

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O2

void __thiscall stackjit::ClassLoader::loadClasses(ClassLoader *this,ImageContainer *imageContainer)

{
  pointer ppAVar1;
  bool bVar2;
  vector<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_> *pvVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Class>_>_>
  *puVar4;
  pointer ppAVar5;
  __node_base *p_Var6;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> classes;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> local_48;
  
  local_68._8_8_ = &local_48;
  local_48.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = std::
             _Function_handler<void_(const_stackjit::Loader::Class_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/loader/classloader.cpp:102:32)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_stackjit::Loader::Class_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/loader/classloader.cpp:102:32)>
             ::_M_manager;
  local_68._M_unused._M_object = imageContainer;
  pvVar3 = ImageContainer::images(imageContainer);
  ppAVar1 = (pvVar3->
            super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar5 = (pvVar3->
                 super__Vector_base<stackjit::AssemblyImage_*,_std::allocator<stackjit::AssemblyImage_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppAVar5 != ppAVar1;
      ppAVar5 = ppAVar5 + 1) {
    bVar2 = AssemblyImage::hasLoadedDefinitions(*ppAVar5);
    if (!bVar2) {
      puVar4 = AssemblyImage::classes_abi_cxx11_(*ppAVar5);
      p_Var6 = &(puVar4->_M_h)._M_before_begin;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        std::function<void_(const_stackjit::Loader::Class_&)>::operator()
                  ((function<void_(const_stackjit::Loader::Class_&)> *)&local_68,
                   (Class *)(p_Var6 + 5));
      }
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  loadClasses(this,&local_48);
  std::vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>::~vector(&local_48)
  ;
  return;
}

Assistant:

void ClassLoader::loadClasses(ImageContainer& imageContainer) {
		std::vector<Loader::Class> classes;
		forEachClass(imageContainer, [&](const stackjit::Loader::Class& classDef) {
			imageContainer.loadClassBody(classDef.name());
			classes.push_back(classDef);
		});

		loadClasses(classes);
	}